

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O2

Abc_Obj_t * Abc_ObjFanin1Ivy(Abc_Ntk_t *p,Ivy_Obj_t *pObj)

{
  Abc_Obj_t *pAVar1;
  
  pAVar1 = Abc_EdgeToNode(p,*(Abc_Edge_t *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 4));
  return (Abc_Obj_t *)((ulong)pAVar1 ^ (ulong)((uint)pObj->pFanin1 & 1));
}

Assistant:

static inline Abc_Obj_t *  Abc_ObjFanin1Ivy( Abc_Ntk_t * p, Ivy_Obj_t * pObj ) { return Abc_ObjNotCond( Abc_EdgeToNode(p, Ivy_ObjFanin1(pObj)->TravId), Ivy_ObjFaninC1(pObj) ); }